

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O3

bool deqp::gles31::Functional::anon_unknown_1::verifyTextureLevelParameterEqual
               (CallLogWrapper *gl,GLenum target,int level,GLenum pname,int refValue,QueryType type)

{
  bool bVar1;
  qpTestResult qVar2;
  ResultCollector result;
  QueriedState state;
  long *local_3d0;
  long local_3c8;
  long local_3c0 [2];
  ResultCollector local_3b0;
  QueriedState local_360;
  Enum<int,_2UL> local_338;
  undefined1 local_328 [8];
  _func_int **local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [6];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  deqp::gls::StateQueryUtil::QueriedState::QueriedState(&local_360);
  local_318[0]._M_allocated_capacity._0_7_ = 0x525245202f2f20;
  local_318[0]._7_4_ = 0x203a524f;
  local_320 = (_func_int **)0xb;
  local_318[0]._M_local_buf[0xb] = '\0';
  local_328 = (undefined1  [8])local_318;
  tcu::ResultCollector::ResultCollector(&local_3b0,gl->m_log,(string *)local_328);
  if (local_328 != (undefined1  [8])local_318) {
    operator_delete((void *)local_328,
                    CONCAT17(local_318[0]._M_local_buf[7],
                             (undefined7)local_318[0]._M_allocated_capacity) + 1);
  }
  local_328 = (undefined1  [8])gl->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"Verifying ",10);
  local_338.m_getName = glu::getTextureLevelParameterName;
  local_338.m_value = pname;
  tcu::Format::Enum<int,_2UL>::toStream(&local_338,(ostream *)&local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,", expecting ",0xc);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::ostream::operator<<(local_1a8,refValue);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,(char *)local_3d0,local_3c8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_3d0 != local_3c0) {
    operator_delete(local_3d0,local_3c0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
  std::ios_base::~ios_base(local_2b0);
  deqp::gls::StateQueryUtil::queryTextureLevelState
            (&local_3b0,gl,type,target,level,pname,&local_360);
  bVar1 = deqp::gls::StateQueryUtil::QueriedState::isUndefined(&local_360);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    deqp::gls::StateQueryUtil::verifyInteger(&local_3b0,&local_360,refValue);
    qVar2 = tcu::ResultCollector::getResult(&local_3b0);
    bVar1 = qVar2 == QP_TEST_RESULT_PASS;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_message._M_dataplus._M_p != &local_3b0.m_message.field_2) {
    operator_delete(local_3b0.m_message._M_dataplus._M_p,
                    local_3b0.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_prefix._M_dataplus._M_p != &local_3b0.m_prefix.field_2) {
    operator_delete(local_3b0.m_prefix._M_dataplus._M_p,
                    local_3b0.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

static bool verifyTextureLevelParameterEqual (glu::CallLogWrapper& gl, glw::GLenum target, int level, glw::GLenum pname, int refValue, QueryType type)
{
	return verifyTextureLevelParameterEqualWithPrinter<IntegerPrinter>(gl, target, level, pname, refValue, type);
}